

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

int xmlConvertSGMLCatalog(xmlCatalogPtr catal)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  int *in_RDI;
  undefined1 local_18 [8];
  
  iVar2 = -1;
  if ((in_RDI != (int *)0x0) && (*in_RDI == 2)) {
    if (xmlDebugCatalogs != 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Converting SGML catalog to XML\n");
    }
    xmlHashScan(*(xmlHashTablePtr *)(in_RDI + 0x18),xmlCatalogConvertEntry,local_18);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
xmlConvertSGMLCatalog(xmlCatalogPtr catal) {

    if ((catal == NULL) || (catal->type != XML_SGML_CATALOG_TYPE))
	return(-1);

    if (xmlDebugCatalogs) {
	xmlGenericError(xmlGenericErrorContext,
		"Converting SGML catalog to XML\n");
    }
    xmlHashScan(catal->sgml, xmlCatalogConvertEntry, &catal);
    return(0);
}